

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Vec_Int_t * Lms_GiaFindNonRedundantCos(Lms_Man_t *p)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *p_00;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  __ptr = Lms_GiaDelays(p->pGia);
  __ptr_00 = Lms_GiaCollectUsefulCos(p);
  iVar2 = __ptr_00->nSize;
  uVar14 = (ulong)iVar2;
  if ((long)uVar14 < 1) {
LAB_002fa85c:
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    piVar9 = (int *)malloc(4000);
    p_00->pArray = piVar9;
    if (0 < iVar2) {
      piVar9 = __ptr_00->pArray;
      uVar11 = 0;
      do {
        if (-1 < piVar9[uVar11]) {
          Vec_IntPush(p_00,piVar9[uVar11]);
        }
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (int *)0x0;
    }
    if (__ptr_00 != (Vec_Int_t *)0x0) {
      free(__ptr_00);
    }
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (word *)0x0;
    }
    if (__ptr != (Vec_Wrd_t *)0x0) {
      free(__ptr);
    }
    return p_00;
  }
  piVar9 = __ptr_00->pArray;
  uVar11 = 1;
  uVar12 = 0;
LAB_002fa741:
  iVar3 = piVar9[uVar12];
  if (-1 < (long)iVar3) {
    iVar4 = __ptr->nSize;
    if (iVar4 <= iVar3) {
LAB_002fa922:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    pwVar6 = __ptr->pArray;
    uVar7 = pwVar6[iVar3];
    if (uVar7 == 0) {
      __assert_fail("D1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x4de,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
    }
    uVar13 = uVar11;
    if (uVar12 + 1 < uVar14) {
      do {
        uVar5 = piVar9[uVar13];
        if ((ulong)uVar5 != 0xfffffffe) {
          if (uVar5 == 0xffffffff) break;
          if (((int)uVar5 < 0) || (iVar4 <= (int)uVar5)) goto LAB_002fa922;
          uVar8 = pwVar6[uVar5];
          if (uVar8 == 0) {
            __assert_fail("D2 > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x4e6,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
          }
          iVar3 = p->pGia->vCis->nSize;
          if (0 < (long)iVar3) {
            lVar1 = (long)iVar3 * 4;
            lVar10 = 0;
            do {
              if (lVar10 == 0x40) goto LAB_002fa903;
              if (((uint)(uVar8 >> ((byte)lVar10 & 0x3f)) & 0xf) <
                  ((uint)(uVar7 >> ((byte)lVar10 & 0x3f)) & 0xf)) {
                if (iVar3 < 1) goto LAB_002fa846;
                lVar10 = 0;
                goto LAB_002fa81a;
              }
              lVar10 = lVar10 + 4;
            } while (lVar1 - lVar10 != 0);
          }
          piVar9[uVar13] = -2;
        }
LAB_002fa805:
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar14);
    }
  }
  goto LAB_002fa84d;
LAB_002fa81a:
  if (lVar10 == 0x40) {
LAB_002fa903:
    __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x71,"int Lms_DelayGet(word, int)");
  }
  if (((uint)(uVar7 >> ((byte)lVar10 & 0x3f)) & 0xf) <
      ((uint)(uVar8 >> ((byte)lVar10 & 0x3f)) & 0xf)) goto LAB_002fa805;
  lVar10 = lVar10 + 4;
  if (lVar1 - lVar10 == 0) goto LAB_002fa846;
  goto LAB_002fa81a;
LAB_002fa846:
  piVar9[uVar12] = -2;
LAB_002fa84d:
  uVar12 = uVar12 + 1;
  uVar11 = uVar11 + 1;
  if (uVar12 == uVar14) goto LAB_002fa85c;
  goto LAB_002fa741;
}

Assistant:

Vec_Int_t * Lms_GiaFindNonRedundantCos( Lms_Man_t * p )
{
    Vec_Int_t * vRemain;
    Vec_Int_t * vUseful;
    Vec_Wrd_t * vDelays;
    int i, k, EntryI, EntryK;
    word D1, D2;
    vDelays = Lms_GiaDelays( p->pGia );
    vUseful = Lms_GiaCollectUsefulCos( p );
    Vec_IntForEachEntry( vUseful, EntryI, i )
    {
        if ( EntryI < 0 )
            continue;
        D1 = Vec_WrdEntry(vDelays, EntryI);
        assert( D1 > 0 );
        Vec_IntForEachEntryStart( vUseful, EntryK, k, i+1 )
        {
            if ( EntryK == -1 )
                break;
            if ( EntryK == -2 )
                continue;
            D2 = Vec_WrdEntry(vDelays, EntryK);
            assert( D2 > 0 );
            if ( Lms_DelayDom(D1, D2, Gia_ManCiNum(p->pGia)) ) // D1 dominate D2
            {
                Vec_IntWriteEntry( vUseful, k, -2 );
                continue;
            }
            if ( Lms_DelayDom(D2, D1, Gia_ManCiNum(p->pGia)) ) // D2 dominate D1
            {
                Vec_IntWriteEntry( vUseful, i, -2 );
                break;
            }
        }
    }

    vRemain = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vUseful, EntryI, i )
        if ( EntryI >= 0 )
            Vec_IntPush( vRemain, EntryI );
    Vec_IntFree( vUseful );
    Vec_WrdFree( vDelays );
    return vRemain;
}